

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHeader_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamHeader::ReadHeaderText(BamHeader *this,BgzfStream *stream,uint32_t *length)

{
  char *pcVar1;
  undefined8 uVar2;
  uint *in_RDX;
  size_t in_RDI;
  size_t bytesRead;
  char *headerText;
  string *in_stack_ffffffffffffff38;
  SamHeader *in_stack_ffffffffffffff40;
  allocator *paVar3;
  string *in_stack_ffffffffffffff50;
  BgzfStream *in_stack_ffffffffffffff58;
  BamException *in_stack_ffffffffffffff60;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  size_t local_28;
  char *local_20;
  uint *local_18;
  
  local_18 = in_RDX;
  local_20 = (char *)calloc((ulong)(*in_RDX + 1),1);
  local_28 = BgzfStream::Read(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_RDI);
  pcVar1 = local_20;
  if (local_28 != *local_18) {
    free(local_20);
    uVar2 = __cxa_allocate_exception(0x28);
    paVar3 = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"BamHeader::ReadHeaderText",paVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"could not read header text",&local_81);
    BamException::BamException
              (in_stack_ffffffffffffff60,(string *)in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50);
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff58,pcVar1,(allocator *)&stack0xffffffffffffff57);
  SamHeader::SetHeaderText(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  free(local_20);
  return;
}

Assistant:

void BamHeader::ReadHeaderText(BgzfStream* stream, const uint32_t& length)
{

    // read header text
    char* headerText = (char*)calloc(length + 1, 1);
    const std::size_t bytesRead = stream->Read(headerText, length);

    // if error reading, clean up buffer & throw
    if (bytesRead != length) {
        free(headerText);
        throw BamException("BamHeader::ReadHeaderText", "could not read header text");
    }

    // otherwise, text was read OK
    // store & cleanup
    m_header.SetHeaderText(static_cast<std::string>((const char*)headerText));
    free(headerText);
}